

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O2

void __thiscall
spvtools::opt::analysis::DebugInfoManager::RegisterDbgInst(DebugInfoManager *this,Instruction *inst)

{
  uint **ppuVar1;
  uint32_t uVar2;
  Operand *pOVar3;
  uint **ppuVar4;
  mapped_type *ppIVar5;
  uint32_t local_1c;
  
  uVar2 = Instruction::NumInOperands(inst);
  if (uVar2 != 0) {
    uVar2 = GetDbgSetImportId(this);
    pOVar3 = Instruction::GetInOperand(inst,0);
    ppuVar1 = (uint **)(pOVar3->words).large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
    ppuVar4 = &(pOVar3->words).small_data_;
    if (ppuVar1 != (uint **)0x0) {
      ppuVar4 = ppuVar1;
    }
    if (uVar2 == **ppuVar4) {
      local_1c = Instruction::result_id(inst);
      ppIVar5 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->id_to_dbg_inst_,&local_1c);
      *ppIVar5 = inst;
      return;
    }
  }
  __assert_fail("inst->NumInOperands() != 0 && (GetDbgSetImportId() == inst->GetInOperand(0).words[0]) && \"Given instruction is not a debug instruction\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                ,0x67,
                "void spvtools::opt::analysis::DebugInfoManager::RegisterDbgInst(Instruction *)");
}

Assistant:

void DebugInfoManager::RegisterDbgInst(Instruction* inst) {
  assert(inst->NumInOperands() != 0 &&
         (GetDbgSetImportId() == inst->GetInOperand(0).words[0]) &&
         "Given instruction is not a debug instruction");
  id_to_dbg_inst_[inst->result_id()] = inst;
}